

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O1

void __thiscall camp::NullObject::NullObject(NullObject *this,Class *objectClass)

{
  pointer pcVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (objectClass == (Class *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"unknown","");
  }
  else {
    psVar2 = Class::name_abi_cxx11_(objectClass);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + psVar2->_M_string_length);
  }
  std::operator+(&local_28,"trying to use a null metaobject of class ",&local_48);
  Error::Error(&this->super_Error,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_Error = &PTR__Error_00134048;
  return;
}

Assistant:

NullObject::NullObject(const Class* objectClass)
    : Error("trying to use a null metaobject of class " + (objectClass ? objectClass->name() : "unknown"))
{
}